

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointcheckpointscheme.c
# Opt level: O1

SUNErrCode
SUNAdjointCheckpointScheme_NeedsSaving
          (SUNAdjointCheckpointScheme_conflict self,suncountertype step_num,suncountertype stage_num
          ,sunrealtype t,int *yes_or_no)

{
  SUNAdjointCheckpointSchemeNeedsSavingFn UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = self->ops->needssaving;
  if (UNRECOVERED_JUMPTABLE != (SUNAdjointCheckpointSchemeNeedsSavingFn)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(self,step_num,stage_num,t,yes_or_no);
    return SVar1;
  }
  return -0x2701;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_NeedsSaving(SUNAdjointCheckpointScheme self,
                                                  suncountertype step_num,
                                                  suncountertype stage_num,
                                                  sunrealtype t,
                                                  sunbooleantype* yes_or_no)
{
  SUNFunctionBegin(self->sunctx);
  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  if (self->ops->needssaving)
  {
    SUNErrCode err = self->ops->needssaving(self, step_num, stage_num, t,
                                            yes_or_no);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }
  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}